

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall soplex::SPxSteepPR<double>::selectEnter(SPxSteepPR<double> *this)

{
  SPxSolverBase<double> *pSVar1;
  SPxOut *pSVar2;
  SVectorBase<double> *rhs;
  SSVectorBase<double> *x;
  double dVar3;
  Verbosity old_verbosity;
  DataKey local_30;
  undefined4 local_28;
  Verbosity local_24;
  
  local_30 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance);
  if (local_30.info == 0) {
    if (this->refined != false) {
      return (SPxId)local_30;
    }
    this->refined = true;
    pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
      local_28 = 5;
      local_24 = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      soplex::operator<<(((this->super_SPxPricer<double>).thesolver)->spxout,
                         "WSTEEP05 trying refinement step..\n");
      pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_24);
    }
    local_30 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance * 0.5);
    if (local_30.info == 0) {
      return (SPxId)local_30;
    }
  }
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  x = &pSVar1->theFvec->thedelta;
  rhs = SPxSolverBase<double>::vector(pSVar1,(SPxId *)&local_30);
  SPxBasisBase<double>::solve4update(&pSVar1->super_SPxBasisBase<double>,x,rhs);
  SSVectorBase<double>::setup_and_assign<double>(&this->workRhs,x);
  dVar3 = SSVectorBase<double>::length2(x);
  this->pi_p = dVar3 + 1.0;
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  pSVar1->coSolveVector2 = &this->workVec;
  pSVar1->coSolveVector2rhs = &this->workRhs;
  return (SPxId)local_30;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);
   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP05 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   assert(isConsistent());

   if(enterId.isValid())
   {
      SSVectorBase<R>& delta = this->thesolver->fVec().delta();

      this->thesolver->basis().solve4update(delta, this->thesolver->vector(enterId));

      workRhs.setup_and_assign(delta);
      pi_p = 1 + delta.length2();

      this->thesolver->setup4coSolve(&workVec, &workRhs);
   }

   return enterId;
}